

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::StringMaker<signed_char,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<signed_char,void> *this,char value)

{
  undefined7 in_register_00000011;
  allocator<char> *__a;
  char *__s;
  char chstr [4];
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  char local_c;
  byte bStack_b;
  undefined2 uStack_a;
  
  switch((int)this) {
  case 9:
    __s = "\'\\t\'";
    __a = &local_10;
    break;
  case 10:
    __s = "\'\\n\'";
    __a = &local_f;
    break;
  default:
    if ((byte)this < 0x20) {
      StringMaker<unsigned_long_long,void>::convert_abi_cxx11_
                (__return_storage_ptr__,(StringMaker<unsigned_long_long,void> *)(long)(int)this,
                 CONCAT71(in_register_00000011,value));
      return __return_storage_ptr__;
    }
    __s = &local_c;
    _local_c = CONCAT22(0x27,CONCAT11((byte)this,0x27));
    __a = &local_11;
    break;
  case 0xc:
    __s = "\'\\f\'";
    __a = &local_e;
    break;
  case 0xd:
    __s = "\'\\r\'";
    __a = &local_d;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<signed char>::convert(signed char value) {
    if (value == '\r') {
      return "'\\r'";
    } else if (value == '\f') {
      return "'\\f'";
    } else if (value == '\n') {
      return "'\\n'";
    } else if (value == '\t') {
      return "'\\t'";
    } else if ('\0' <= value && value < ' ') {
      return ::Catch::Detail::stringify(static_cast<unsigned int>(value));
    } else {
      char chstr[] = "' '";
      chstr[1] = value;
      return chstr;
    }
  }